

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdf-create.cc
# Opt level: O2

void add_page(QPDFPageDocumentHelper *dh,QPDFObjectHandle *font,string *color_space,string *filter)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  QPDFPageObjectHelper QVar2;
  ImageProvider *this;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  QPDFObjectHandle QVar3;
  QPDFObjectHandle QVar4;
  string contents_1;
  QPDFObjectHandle page;
  QPDFObjectHandle resources;
  QPDFObjectHandle image_dict;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  QPDFObjectHandle image;
  QPDFObjectHandle xobject;
  QPDFObjectHandle rfont;
  char local_e8 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_e0;
  QPDFObjectHandle contents;
  QPDFObjectHandle procset;
  __shared_ptr<QPDFObjectHandle::StreamDataProvider,_(__gnu_cxx::_Lock_policy)2> local_b8;
  shared_ptr<QPDFObjectHandle::StreamDataProvider> provider;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  QPDFPageObjectHelper local_68;
  
  _Var1._M_pi = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)&dh->field_0x8;
  this = (ImageProvider *)operator_new(0x88);
  ImageProvider::ImageProvider(this,color_space,filter);
  std::__shared_ptr<QPDFObjectHandle::StreamDataProvider,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<ImageProvider,void>
            ((__shared_ptr<QPDFObjectHandle::StreamDataProvider,(__gnu_cxx::_Lock_policy)2> *)
             &provider,this);
  QPDF::newStream();
  operator____qpdf((char *)&image_dict,0x109092);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&contents_1,"/ColorSpace",(allocator<char> *)&local_148);
  QPDFObjectHandle::newName((string *)&page);
  QPDFObjectHandle::replaceKey((string *)&image_dict,(QPDFObjectHandle *)&contents_1);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&page.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__cxx11::string::~string((string *)&contents_1);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&contents_1,"/Width",(allocator<char> *)&local_148);
  newInteger((size_t)contents_1._M_dataplus._M_p);
  QPDFObjectHandle::replaceKey((string *)&image_dict,(QPDFObjectHandle *)&contents_1);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&page.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__cxx11::string::~string((string *)&contents_1);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&contents_1,"/Height",(allocator<char> *)&local_148);
  newInteger((size_t)contents_1._M_dataplus._M_p);
  QPDFObjectHandle::replaceKey((string *)&image_dict,(QPDFObjectHandle *)&contents_1);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&page.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__cxx11::string::~string((string *)&contents_1);
  QPDFObjectHandle::replaceDict(&image);
  std::__shared_ptr<QPDFObjectHandle::StreamDataProvider,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_b8,
             &provider.
              super___shared_ptr<QPDFObjectHandle::StreamDataProvider,_(__gnu_cxx::_Lock_policy)2>);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&contents_1,"",(allocator<char> *)&local_88);
  QPDFObjectHandle::parse((string *)&page,(string *)filter);
  QPDFObjectHandle::newNull();
  QPDFObjectHandle::replaceStreamData(&image,&local_b8,&page,&local_148);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_148._M_string_length);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&page.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__cxx11::string::~string((string *)&contents_1);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_b8._M_refcount);
  operator____qpdf((char *)&procset,0x1090e5);
  QPDFObjectHandle::newDictionary();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&contents_1,"/F1",(allocator<char> *)&page);
  QPDFObjectHandle::replaceKey((string *)&rfont,(QPDFObjectHandle *)&contents_1);
  std::__cxx11::string::~string((string *)&contents_1);
  QPDFObjectHandle::newDictionary();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&contents_1,"/Im1",(allocator<char> *)&page);
  QPDFObjectHandle::replaceKey((string *)&xobject,(QPDFObjectHandle *)&contents_1);
  std::__cxx11::string::~string((string *)&contents_1);
  QPDFObjectHandle::newDictionary();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&contents_1,"/ProcSet",(allocator<char> *)&page);
  QPDFObjectHandle::replaceKey((string *)&resources,(QPDFObjectHandle *)&contents_1);
  std::__cxx11::string::~string((string *)&contents_1);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&contents_1,"/Font",(allocator<char> *)&page);
  QPDFObjectHandle::replaceKey((string *)&resources,(QPDFObjectHandle *)&contents_1);
  std::__cxx11::string::~string((string *)&contents_1);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&contents_1,"/XObject",(allocator<char> *)&page);
  QPDFObjectHandle::replaceKey((string *)&resources,(QPDFObjectHandle *)&contents_1);
  std::__cxx11::string::~string((string *)&contents_1);
  std::operator+(&local_88,color_space," with filter ");
  std::operator+(&local_148,&local_88,filter);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&page,
                 "BT /F1 24 Tf 72 320 Td (",&local_148);
  std::operator+(&contents_1,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&page,
                 ") Tj ET\nq 244 0 0 144 184 100 cm /Im1 Do Q\n");
  std::__cxx11::string::~string((string *)&page);
  QPDF::newStream((string *)&contents);
  std::__cxx11::string::~string((string *)&contents_1);
  std::__cxx11::string::~string((string *)&local_148);
  std::__cxx11::string::~string((string *)&local_88);
  operator____qpdf(local_e8,0x109129);
  QVar3.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = _Var1._M_pi;
  QVar3.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)&page;
  QPDF::makeIndirectObject(QVar3);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_e0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&contents_1,"/Contents",(allocator<char> *)&local_148);
  QPDFObjectHandle::replaceKey((string *)&page,(QPDFObjectHandle *)&contents_1);
  std::__cxx11::string::~string((string *)&contents_1);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&contents_1,"/Resources",(allocator<char> *)&local_148);
  QPDFObjectHandle::replaceKey((string *)&page,(QPDFObjectHandle *)&contents_1);
  std::__cxx11::string::~string((string *)&contents_1);
  std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_98,(__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&page);
  QVar4.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = extraout_RDX._M_pi;
  QVar4.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)&local_98;
  QPDFPageObjectHelper::QPDFPageObjectHelper(&local_68,QVar4);
  QVar2._8_48_ = stack0xfffffffffffffe60;
  QVar2._0_8_ = contents_1._M_dataplus._M_p;
  QPDFPageDocumentHelper::addPage(QVar2,SUB81(dh,0));
  QPDFPageObjectHelper::~QPDFPageObjectHelper(&local_68);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_98._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&page.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&contents.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&resources.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&xobject.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&rfont.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&procset.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&image_dict.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&image.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&provider.
              super___shared_ptr<QPDFObjectHandle::StreamDataProvider,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return;
}

Assistant:

void
add_page(
    QPDFPageDocumentHelper& dh,
    QPDFObjectHandle font,
    std::string const& color_space,
    std::string const& filter)
{
    QPDF& pdf(dh.getQPDF());

    // Create a stream to encode our image. QPDFWriter will fill in the length and will respect our
    // filters based on stream data mode. Since we are not specifying, QPDFWriter will compress with
    // /FlateDecode if we don't provide any other form of compression.
    auto* p = new ImageProvider(color_space, filter);
    std::shared_ptr<QPDFObjectHandle::StreamDataProvider> provider(p);
    size_t width = p->getWidth();
    size_t height = p->getHeight();
    QPDFObjectHandle image = pdf.newStream();
    auto image_dict =
        // line-break
        "<<"
        " /Type /XObject"
        " /Subtype /Image"
        " /BitsPerComponent 8"
        ">>"_qpdf;
    image_dict.replaceKey("/ColorSpace", newName(color_space));
    image_dict.replaceKey("/Width", newInteger(width));
    image_dict.replaceKey("/Height", newInteger(height));
    image.replaceDict(image_dict);

    // Provide the stream data.
    image.replaceStreamData(provider, QPDFObjectHandle::parse(filter), QPDFObjectHandle::newNull());

    // Create direct objects as needed by the page dictionary.
    QPDFObjectHandle procset = "[/PDF /Text /ImageC]"_qpdf;

    QPDFObjectHandle rfont = QPDFObjectHandle::newDictionary();
    rfont.replaceKey("/F1", font);

    QPDFObjectHandle xobject = QPDFObjectHandle::newDictionary();
    xobject.replaceKey("/Im1", image);

    QPDFObjectHandle resources = QPDFObjectHandle::newDictionary();
    resources.replaceKey("/ProcSet", procset);
    resources.replaceKey("/Font", rfont);
    resources.replaceKey("/XObject", xobject);

    // Create the page content stream
    QPDFObjectHandle contents = createPageContents(pdf, color_space + " with filter " + filter);

    // Create the page dictionary
    QPDFObjectHandle page = pdf.makeIndirectObject(
        "<<"
        " /Type /Page"
        " /MediaBox [0 0 612 392]"
        ">>"_qpdf);
    page.replaceKey("/Contents", contents);
    page.replaceKey("/Resources", resources);

    // Add the page to the PDF file
    dh.addPage(page, false);
}